

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

uint __thiscall
ON_SubDMeshFragmentIterator::TotalPointCount(ON_SubDMeshFragmentIterator *this,uint mesh_density)

{
  uint uVar1;
  uint uVar2;
  uint half_size_point_count;
  uint full_size_point_count;
  uint half_size_fragment_count;
  uint full_size_fragment_count;
  uint mesh_density_local;
  ON_SubDMeshFragmentIterator *this_local;
  
  half_size_fragment_count = mesh_density;
  _full_size_fragment_count = this;
  half_size_fragment_count = ClampMeshDensity(this,mesh_density);
  full_size_point_count = 0;
  half_size_point_count = 0;
  GetFragmentCounts(this,&full_size_point_count,&half_size_point_count);
  uVar1 = ON_SubDMeshFragment::FullFragmentMeshPointCountFromDensity(half_size_fragment_count);
  uVar2 = ON_SubDMeshFragment::HalfFragmentMeshPointCountFromDensity(half_size_fragment_count);
  return full_size_point_count * uVar1 + half_size_point_count * uVar2;
}

Assistant:

unsigned int ON_SubDMeshFragmentIterator::TotalPointCount(
  unsigned int mesh_density
  ) const
{
  mesh_density = ClampMeshDensity(mesh_density);
  unsigned int full_size_fragment_count = 0;
  unsigned int half_size_fragment_count = 0;
  ON_SubDMeshFragmentIterator::GetFragmentCounts(full_size_fragment_count, half_size_fragment_count);
  // const unsigned int grid_side_count = 1 << mesh_density;
  const unsigned int full_size_point_count = ON_SubDMeshFragment::FullFragmentMeshPointCountFromDensity(mesh_density);
  const unsigned int half_size_point_count = ON_SubDMeshFragment::HalfFragmentMeshPointCountFromDensity(mesh_density);
  return full_size_fragment_count * full_size_point_count + half_size_fragment_count * half_size_point_count;
}